

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

int luv_tcp_nodelay(lua_State *L)

{
  int iVar1;
  uv_tcp_t *handle_00;
  int enable;
  int ret;
  uv_tcp_t *handle;
  lua_State *L_local;
  
  handle_00 = luv_check_tcp(L,1);
  luaL_checktype(L,2,1);
  iVar1 = lua_toboolean(L,2);
  iVar1 = uv_tcp_nodelay(handle_00,iVar1);
  if (iVar1 < 0) {
    L_local._4_4_ = luv_error(L,iVar1);
  }
  else {
    lua_pushinteger(L,(long)iVar1);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int luv_tcp_nodelay(lua_State* L) {
  uv_tcp_t* handle = luv_check_tcp(L, 1);
  int ret, enable;
  luaL_checktype(L, 2, LUA_TBOOLEAN);
  enable = lua_toboolean(L, 2);
  ret = uv_tcp_nodelay(handle, enable);
  return luv_result(L, ret);
}